

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VScaleAddMulti_Serial(int nvec,realtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  realtype *zd;
  realtype *yd;
  realtype *xd;
  N_Vector in_stack_00000020;
  sunindextype N;
  sunindextype j;
  int i;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_4;
  
  if (in_EDI < 1) {
    local_4 = -1;
  }
  else if (in_EDI == 1) {
    N_VLinearSum_Serial((realtype)x,(N_Vector)Y,(realtype)Z,_j,in_stack_00000020);
    local_4 = 0;
  }
  else {
    iVar1 = *(int *)*in_RDX;
    lVar2 = *(long *)(*in_RDX + 8);
    if (in_RCX == in_R8) {
      for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
        lVar3 = *(long *)(**(long **)(in_RCX + (long)local_2c * 8) + 8);
        for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
          *(double *)(lVar3 + (long)local_30 * 8) =
               *(double *)(in_RSI + (long)local_2c * 8) * *(double *)(lVar2 + (long)local_30 * 8) +
               *(double *)(lVar3 + (long)local_30 * 8);
        }
      }
      local_4 = 0;
    }
    else {
      for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
        lVar3 = *(long *)(**(long **)(in_RCX + (long)local_2c * 8) + 8);
        lVar4 = *(long *)(**(long **)(in_R8 + (long)local_2c * 8) + 8);
        for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
          *(double *)(lVar4 + (long)local_30 * 8) =
               *(double *)(in_RSI + (long)local_2c * 8) * *(double *)(lVar2 + (long)local_30 * 8) +
               *(double *)(lVar3 + (long)local_30 * 8);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int N_VScaleAddMulti_Serial(int nvec, realtype* a, N_Vector x, N_Vector* Y, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VLinearSum */
  if (nvec == 1) {
    N_VLinearSum_Serial(a[0], x, ONE, Y[0], Z[0]);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z) {
    for (i=0; i<nvec; i++) {
      yd = NV_DATA_S(Y[i]);
      for (j=0; j<N; j++) {
        yd[j] += a[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i=0; i<nvec; i++) {
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = a[i] * xd[j] + yd[j];
    }
  }
  return(0);
}